

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockets.h
# Opt level: O3

int open_nb_socket(char *addr,char *port)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  addrinfo *paVar4;
  addrinfo *servinfo;
  addrinfo *local_50;
  addrinfo local_48;
  
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 0;
  iVar1 = getaddrinfo(addr,port,&local_48,&local_50);
  if (iVar1 == 0) {
    paVar4 = local_50;
    if (local_50 == (addrinfo *)0x0) {
      local_50 = (addrinfo *)0x0;
    }
    else {
      do {
        iVar1 = socket(paVar4->ai_family,paVar4->ai_socktype,paVar4->ai_protocol);
        if (iVar1 != -1) {
          iVar2 = connect(iVar1,paVar4->ai_addr,paVar4->ai_addrlen);
          if (iVar2 != -1) {
            freeaddrinfo(local_50);
            uVar3 = fcntl(iVar1,3);
            fcntl(iVar1,4,(ulong)(uVar3 | 0x800));
            return iVar1;
          }
          close(iVar1);
        }
        paVar4 = paVar4->ai_next;
      } while (paVar4 != (addrinfo *)0x0);
    }
    freeaddrinfo(local_50);
  }
  else {
    open_nb_socket_cold_1();
  }
  return -1;
}

Assistant:

int open_nb_socket(const char* addr, const char* port) {
    struct addrinfo hints = {0};

    hints.ai_family = AF_UNSPEC; /* IPv4 or IPv6 */
    hints.ai_socktype = SOCK_STREAM; /* Must be TCP */
    int sockfd = -1;
    int rv;
    struct addrinfo *p, *servinfo;

    /* get address information */
    rv = getaddrinfo(addr, port, &hints, &servinfo);
    if(rv != 0) {
        fprintf(stderr, "Failed to open socket (getaddrinfo): %s\n", gai_strerror(rv));
        return -1;
    }

    /* open the first possible socket */
    for(p = servinfo; p != NULL; p = p->ai_next) {
        sockfd = socket(p->ai_family, p->ai_socktype, p->ai_protocol);
        if (sockfd == -1) continue;

        /* connect to server */
        rv = connect(sockfd, p->ai_addr, p->ai_addrlen);
        if(rv == -1) {
          close(sockfd);
          sockfd = -1;
          continue;
        }
        break;
    }  

    /* free servinfo */
    freeaddrinfo(servinfo);

    /* make non-blocking */
#if !defined(WIN32)
    if (sockfd != -1) fcntl(sockfd, F_SETFL, fcntl(sockfd, F_GETFL) | O_NONBLOCK);
#else
    if (sockfd != INVALID_SOCKET) {
        int iMode = 1;
        ioctlsocket(sockfd, FIONBIO, &iMode);
    }
#endif
#if defined(__VMS)
    /* 
        OpenVMS only partially implements fcntl. It works on file descriptors
        but silently fails on socket descriptors. So we need to fall back on
        to the older ioctl system to set non-blocking IO
    */
    int on = 1;                 
    if (sockfd != -1) ioctl(sockfd, FIONBIO, &on);
#endif

    /* return the new socket fd */
    return sockfd;
}